

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

qpdflogger_handle qpdfjob_get_logger(qpdfjob_handle j)

{
  _qpdflogger_handle *this;
  QPDFJob local_20;
  qpdfjob_handle local_10;
  qpdfjob_handle j_local;
  
  local_10 = j;
  this = (_qpdflogger_handle *)operator_new(0x10);
  QPDFJob::getLogger(&local_20);
  _qpdflogger_handle::_qpdflogger_handle(this,(shared_ptr<QPDFLogger> *)&local_20);
  std::shared_ptr<QPDFLogger>::~shared_ptr((shared_ptr<QPDFLogger> *)&local_20);
  return this;
}

Assistant:

qpdflogger_handle
qpdfjob_get_logger(qpdfjob_handle j)
{
    return new _qpdflogger_handle(j->j.getLogger());
}